

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Builder * __thiscall
capnp::_::PointerBuilder::getBlob<capnp::Text>
          (Builder *__return_storage_ptr__,PointerBuilder *this,void *defaultValue,
          ByteCount defaultSize)

{
  CapTableBuilder *capTable;
  word *pwVar1;
  BuilderArena *this_00;
  uint uVar2;
  SegmentBuilder *this_01;
  WirePointer *pWVar3;
  ulong uVar4;
  WirePointer *pWVar5;
  WirePointer *ref;
  uint uVar6;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *this_02;
  AllocateResult AVar7;
  ThrowOverflow local_69;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  
  ref = this->pointer;
  this_01 = this->segment;
  capTable = this->capTable;
  uVar2 = assertMax<536870910u,unsigned_int,kj::ThrowOverflow>(defaultSize,&local_69);
  uVar6 = (ref->offsetAndKind).value;
  if ((ref->field_1).structRef != (StructRef)0x0 || uVar6 != 0) {
    if ((uVar6 & 3) == 2) {
      this_01 = BuilderArena::getSegment
                          ((BuilderArena *)(this_01->super_SegmentReader).arena,
                           (SegmentId)(ref->field_1).structRef);
      uVar6 = (ref->offsetAndKind).value;
      pwVar1 = (this_01->super_SegmentReader).ptr.ptr;
      uVar4 = (ulong)(uVar6 & 0xfffffff8);
      pWVar5 = (WirePointer *)((long)&pwVar1->content + uVar4);
      ref = (WirePointer *)((long)&pwVar1[1].content + uVar4);
      if ((uVar6 & 4) == 0) {
        pWVar3 = ref + ((int)(pWVar5->offsetAndKind).value >> 2);
        ref = pWVar5;
      }
      else {
        this_01 = BuilderArena::getSegment
                            ((BuilderArena *)(this_01->super_SegmentReader).arena,
                             (SegmentId)(pWVar5->field_1).structRef);
        pWVar3 = (WirePointer *)
                 ((long)&((this_01->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((pWVar5->offsetAndKind).value & 0xfffffff8));
      }
    }
    else {
      pWVar3 = ref + (long)((int)uVar6 >> 2) + 1;
    }
    if (this_01->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_01);
    }
    _kjCondition.left = (ref->offsetAndKind).value & OTHER;
    _kjCondition.right = LIST;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == LIST;
    if (_kjCondition.left == LIST) {
      uVar6 = (ref->field_1).upper32Bits;
      _kjCondition._0_8_ = CONCAT71(_kjCondition._1_7_,(byte)uVar6) & 0xffffffffffffff07;
      _kjCondition.left._1_1_ = 2;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = ((byte)uVar6 & 7) == 2;
      if (_kjCondition.result) {
        if (uVar6 < 8) {
          this_02 = &_kjCondition;
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                    ((Fault *)this_02,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x6a3,FAILED,(char *)0x0,
                     "\"zero-size blob can\'t be text (need NUL terminator)\"",
                     (char (*) [51])"zero-size blob can\'t be text (need NUL terminator)");
        }
        else {
          uVar4 = (ulong)((uVar6 >> 3) - 1);
          _kjCondition._0_8_ = (long)&(pWVar3->offsetAndKind).value + uVar4;
          _kjCondition.op.content.ptr = ") const {\n  return which() == ";
          _kjCondition.op.content.size_ = (long)"() {\n  return which() == " + 0x15;
          _kjCondition.result = true;
          _kjCondition._25_7_ = 0;
          if (*(char *)((long)&(pWVar3->offsetAndKind).value + uVar4) == '\0') {
            (__return_storage_ptr__->content).ptr = (char *)pWVar3;
            (__return_storage_ptr__->content).size_ = uVar4 + 1;
            return __return_storage_ptr__;
          }
          this_02 = (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)&f;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_char&,char>&,char_const(&)[34]>
                    ((Fault *)this_02,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x69d,FAILED,"*(bptr + size) == \'\\0\'",
                     "_kjCondition,\"Text blob missing NUL terminator.\"",
                     (DebugComparison<unsigned_char_&,_char> *)&_kjCondition,
                     (char (*) [34])"Text blob missing NUL terminator.");
        }
      }
      else {
        this_02 = (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)&f;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[94]>
                  ((Fault *)this_02,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x696,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                   "_kjCondition,\"Schema mismatch: Called getText{Field,Element}() but existing list pointer is not \" \"byte-sized.\""
                   ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)&_kjCondition,
                   (char (*) [94])
                   "Schema mismatch: Called getText{Field,Element}() but existing list pointer is not byte-sized."
                  );
      }
    }
    else {
      this_02 = (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)&f;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
                ((Fault *)this_02,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x691,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getText{Field,Element}() but existing pointer is not a list.\""
                 ,&_kjCondition,
                 (char (*) [85])
                 "Schema mismatch: Called getText{Field,Element}() but existing pointer is not a list."
                );
    }
    kj::_::Debug::Fault::~Fault((Fault *)this_02);
  }
  if (uVar2 == 0) {
    (__return_storage_ptr__->content).ptr = &Text::Builder::nulstr;
    (__return_storage_ptr__->content).size_ = 1;
  }
  else {
    uVar6 = uVar2 + 8 >> 3;
    if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
      WireHelpers::zeroObject(this_01,capTable,ref);
    }
    pWVar3 = (WirePointer *)this_01->pos;
    if (((long)((long)(this_01->super_SegmentReader).ptr.ptr +
               ((this_01->super_SegmentReader).ptr.size_ * 8 - (long)pWVar3)) >> 3 <
         (long)(ulong)uVar6) ||
       (this_01->pos = (word *)(pWVar3 + uVar6), pWVar3 == (WirePointer *)0x0)) {
      this_00 = (BuilderArena *)(this_01->super_SegmentReader).arena;
      uVar6 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                        (uVar6 + 1,(anon_class_1_0_00000001 *)&_kjCondition);
      AVar7 = BuilderArena::allocate(this_00,uVar6);
      pWVar5 = (WirePointer *)AVar7.words;
      (ref->offsetAndKind).value =
           (int)AVar7.words - *(int *)&((AVar7.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U
           | 2;
      ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                     ((AVar7.segment)->super_SegmentReader).id.value;
      (pWVar5->offsetAndKind).value = 1;
      pWVar3 = pWVar5 + 1;
    }
    else {
      (ref->offsetAndKind).value = ((uint)((ulong)((long)pWVar3 - (long)ref) >> 1) & 0xfffffffc) - 3
      ;
      pWVar5 = ref;
    }
    (pWVar5->field_1).upper32Bits = uVar2 * 8 + 10;
    (__return_storage_ptr__->content).ptr = (char *)pWVar3;
    (__return_storage_ptr__->content).size_ = (ulong)uVar2 + 1;
    memcpy(pWVar3,defaultValue,(ulong)uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Text::Builder PointerBuilder::getBlob<Text>(const void* defaultValue, ByteCount defaultSize) {
  return WireHelpers::getWritableTextPointer(pointer, segment, capTable, defaultValue,
      assertMax<MAX_TEXT_SIZE>(defaultSize, ThrowOverflow()));
}